

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionForDecPOMDP.cpp
# Opt level: O1

string * __thiscall
QFunctionForDecPOMDP::GetCacheFilename_abi_cxx11_
          (string *__return_storage_ptr__,QFunctionForDecPOMDP *this)

{
  long *plVar1;
  PlanningUnit *pu;
  ostream *poVar2;
  long lVar3;
  double dVar4;
  stringstream ss;
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"GMAA","");
  pu = (PlanningUnit *)(**(code **)((long)this->super_QFunction + 0x60))(this);
  directories::MADPGetResultsDir(&local_1d0,&local_1f0,pu);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  lVar3 = *(long *)((long)this->super_QFunction + -0x60);
  (**(code **)(*(long *)(&(this->super_QFunction).field_0x0 + lVar3) + 0x48))
            (&local_210,&(this->super_QFunction).field_0x0 + lVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"heuristic_h",0xb);
  (**(code **)((long)this->super_QFunction + 0x60))(this);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  lVar3 = (**(code **)((long)this->super_QFunction + 0x60))(this);
  plVar1 = *(long **)(lVar3 + 0x330);
  dVar4 = (double)(**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                            ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"_g",2);
    lVar3 = (**(code **)((long)this->super_QFunction + 0x60))(this);
    plVar1 = *(long **)(lVar3 + 0x330);
    dVar4 = (double)(**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                              ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
    std::ostream::_M_insert<double>(dVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string QFunctionForDecPOMDP::GetCacheFilename() const
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU())
       << "/" << SoftPrintBrief() << "heuristic_h" << GetPU()->GetHorizon();
    if(GetPU()->GetDiscount()!=1)
        ss << "_g" << GetPU()->GetDiscount();
    return(ss.str());
}